

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode Variant_copy(UA_Variant *src,UA_Variant *dst,UA_DataType *_)

{
  UA_StatusCode UVar1;
  ulong size;
  
  size = (ulong)((void *)0x1 < src->data);
  if (src->arrayLength != 0) {
    size = src->arrayLength;
  }
  UVar1 = UA_Array_copy(src->data,size,&dst->data,src->type);
  if (UVar1 == 0) {
    dst->arrayLength = src->arrayLength;
    dst->type = src->type;
    UVar1 = 0;
    if ((src->arrayDimensions != (UA_UInt32 *)0x0) &&
       (UVar1 = UA_Array_copy(src->arrayDimensions,src->arrayDimensionsSize,&dst->arrayDimensions,
                              UA_TYPES + 5), UVar1 == 0)) {
      dst->arrayDimensionsSize = src->arrayDimensionsSize;
      UVar1 = 0;
    }
  }
  return UVar1;
}

Assistant:

static UA_StatusCode
Variant_copy(UA_Variant const *src, UA_Variant *dst, const UA_DataType *_) {
    size_t length = src->arrayLength;
    if(UA_Variant_isScalar(src))
        length = 1;
    UA_StatusCode retval = UA_Array_copy(src->data, length,
                                         &dst->data, src->type);
    if(retval != UA_STATUSCODE_GOOD)
        return retval;
    dst->arrayLength = src->arrayLength;
    dst->type = src->type;
    if(src->arrayDimensions) {
        retval = UA_Array_copy(src->arrayDimensions, src->arrayDimensionsSize,
            (void**)&dst->arrayDimensions, &UA_TYPES[UA_TYPES_INT32]);
        if(retval != UA_STATUSCODE_GOOD)
            return retval;
        dst->arrayDimensionsSize = src->arrayDimensionsSize;
    }
    return UA_STATUSCODE_GOOD;
}